

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::removeColumns(tst_GenericModel *this)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  const_reference pQVar6;
  qint32 local_58c;
  qsizetype local_588;
  QSignalSpy *local_580;
  QSignalSpy *spy_6;
  QSignalSpy **__end1_6;
  QSignalSpy **__begin1_6;
  QSignalSpy *(*__range1_6) [2];
  QModelIndex local_548;
  qint32 local_52c;
  qsizetype local_528;
  QSignalSpy *local_520;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  QModelIndex local_4e8;
  qint32 local_4cc;
  qsizetype local_4c8;
  QSignalSpy *local_4c0;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QModelIndex local_488;
  qint32 local_46c;
  qsizetype local_468;
  QSignalSpy *local_460;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  QModelIndex local_428;
  QVariant local_410;
  QModelIndex local_3f0;
  QModelIndex local_3d8;
  undefined1 local_3c0 [8];
  value_type args_2;
  qsizetype local_3a0;
  QSignalSpy *local_398;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  QModelIndex local_360;
  QVariant local_348;
  QModelIndex local_328;
  QModelIndex local_310;
  undefined1 local_2f8 [8];
  value_type args_1;
  qsizetype local_2d8;
  QSignalSpy *local_2d0;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  QModelIndex local_298;
  QVariant local_280;
  QModelIndex local_260;
  QModelIndex local_248;
  undefined1 local_230 [8];
  value_type args;
  qsizetype local_210;
  QSignalSpy *local_208;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QModelIndex local_1d0;
  QSignalSpy *local_1b8;
  QSignalSpy *spyArr [2];
  QSignalSpy columnsRemovedSpy;
  QSignalSpy columnsAboutToBeRemovedSpy;
  QModelIndex local_80;
  QModelIndex local_68;
  undefined1 local_40 [8];
  ModelTest probe;
  GenericModel testModel;
  int insertRow;
  tst_GenericModel *this_local;
  
  iVar4 = qMetaTypeId<int>();
  puVar5 = (uint *)QTest::qData("insertRow",iVar4);
  uVar1 = *puVar5;
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_40,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  if (0 < (int)uVar1) {
    QModelIndex::QModelIndex(&local_68);
    GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)(ulong)uVar1);
  }
  QModelIndex::QModelIndex(&local_80);
  bVar2 = GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0xd);
  bVar2 = QTest::qVerify((bool)(bVar2 & 1),"testModel.insertColumns(0, 13)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x18e);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    QVariant::QVariant((QVariant *)&columnsAboutToBeRemovedSpy.m_waiting,1);
    GenericModel::setHeaderData
              ((int)&probe + 8,10,(QVariant *)0x1,(int)&columnsAboutToBeRemovedSpy + 0x78);
    QVariant::~QVariant((QVariant *)&columnsAboutToBeRemovedSpy.m_waiting);
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)&columnsRemovedSpy.m_waiting,(QObject *)&probe.field_0x8,
               "2columnsAboutToBeRemoved(QModelIndex, int, int)");
    bVar3 = QSignalSpy::isValid((QSignalSpy *)&columnsRemovedSpy.m_waiting);
    bVar2 = QTest::qVerify(bVar3,"columnsAboutToBeRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x192);
    if ((bVar2 & 1) != 0) {
      QSignalSpy::QSignalSpy
                ((QSignalSpy *)(spyArr + 1),(QObject *)&probe.field_0x8,
                 "2columnsRemoved(QModelIndex, int, int)");
      bVar3 = QSignalSpy::isValid((QSignalSpy *)(spyArr + 1));
      bVar2 = QTest::qVerify(bVar3,"columnsRemovedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x194);
      if ((bVar2 & 1) != 0) {
        local_1b8 = (QSignalSpy *)(spyArr + 1);
        spyArr[0] = (QSignalSpy *)&columnsRemovedSpy.m_waiting;
        QModelIndex::QModelIndex(&local_1d0);
        bVar2 = GenericModel::removeColumns((int)&probe + 8,0,(QModelIndex *)0x1);
        bVar2 = QTest::qVerify((bool)(bVar2 & 1),"testModel.removeColumns(0, 1)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x197);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex((QModelIndex *)&__range1);
          iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
          bVar2 = QTest::qCompare(iVar4,0xc,"testModel.columnCount()","12",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x198);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            spy = (QSignalSpy *)(spyArr + 1);
            __end1 = &local_1b8;
            __begin1 = __end1;
            for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
              local_208 = *__end1;
              local_210 = QList<QList<QVariant>_>::count(&local_208->super_QList<QList<QVariant>_>);
              args.d.size._4_4_ = 1;
              bVar3 = QTest::qCompare<long_long,int>
                                (&local_210,(qint32 *)((long)&args.d.size + 4),"spy->count()","1",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x19a);
              if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_00112314;
              QList<QList<QVariant>_>::takeFirst
                        ((value_type *)local_230,&local_208->super_QList<QList<QVariant>_>);
              pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_230,2);
              iVar4 = QVariant::toInt((bool *)pQVar6);
              bVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x19c);
              if ((bVar2 & 1) == 0) {
                bVar3 = true;
              }
              else {
                pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_230,1);
                iVar4 = QVariant::toInt((bool *)pQVar6);
                bVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x19d);
                if ((bVar2 & 1) == 0) {
                  bVar3 = true;
                }
                else {
                  pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_230,0);
                  QVariant::value<QModelIndex>(&local_248,pQVar6);
                  QModelIndex::QModelIndex(&local_260);
                  bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                    (&local_248,&local_260,"args.at(0).value<QModelIndex>()",
                                     "QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x19e);
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                    bVar3 = false;
                  }
                  else {
                    bVar3 = true;
                  }
                }
              }
              QList<QVariant>::~QList((QList<QVariant> *)local_230);
              if (bVar3) goto LAB_00112314;
            }
            GenericModel::headerData((int)&local_280,(int)&probe + 8,9);
            iVar4 = QVariant::toInt((bool *)&local_280);
            bVar2 = QTest::qCompare(iVar4,1,"testModel.headerData(9, Qt::Horizontal).toInt()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x1a0);
            QVariant::~QVariant(&local_280);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex(&local_298);
              bVar2 = GenericModel::removeColumns((int)&probe + 8,0,(QModelIndex *)0x2);
              bVar2 = QTest::qVerify((bool)(bVar2 & 1),"testModel.removeColumns(0, 2)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x1a1);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                QModelIndex::QModelIndex((QModelIndex *)&__range1_1);
                iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
                bVar2 = QTest::qCompare(iVar4,10,"testModel.columnCount()","10",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x1a2);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  spy_1 = (QSignalSpy *)(spyArr + 1);
                  __end1_1 = &local_1b8;
                  __begin1_1 = __end1_1;
                  for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
                    local_2d0 = *__end1_1;
                    local_2d8 = QList<QList<QVariant>_>::count
                                          (&local_2d0->super_QList<QList<QVariant>_>);
                    args_1.d.size._4_4_ = 1;
                    bVar3 = QTest::qCompare<long_long,int>
                                      (&local_2d8,(qint32 *)((long)&args_1.d.size + 4),
                                       "spy->count()","1",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x1a4);
                    if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_00112314;
                    QList<QList<QVariant>_>::takeFirst
                              ((value_type *)local_2f8,&local_2d0->super_QList<QList<QVariant>_>);
                    pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_2f8,2);
                    iVar4 = QVariant::toInt((bool *)pQVar6);
                    bVar2 = QTest::qCompare(iVar4,1,"args.at(2).toInt()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x1a6);
                    if ((bVar2 & 1) == 0) {
                      bVar3 = true;
                    }
                    else {
                      pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_2f8,1);
                      iVar4 = QVariant::toInt((bool *)pQVar6);
                      bVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x1a7);
                      if ((bVar2 & 1) == 0) {
                        bVar3 = true;
                      }
                      else {
                        pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_2f8,0);
                        QVariant::value<QModelIndex>(&local_310,pQVar6);
                        QModelIndex::QModelIndex(&local_328);
                        bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                          (&local_310,&local_328,"args.at(0).value<QModelIndex>()",
                                           "QModelIndex()",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x1a8);
                        if (((bVar3 ^ 0xffU) & 1) == 0) {
                          bVar3 = false;
                        }
                        else {
                          bVar3 = true;
                        }
                      }
                    }
                    QList<QVariant>::~QList((QList<QVariant> *)local_2f8);
                    if (bVar3) goto LAB_00112314;
                  }
                  GenericModel::headerData((int)&local_348,(int)&probe + 8,7);
                  iVar4 = QVariant::toInt((bool *)&local_348);
                  bVar2 = QTest::qCompare(iVar4,1,"testModel.headerData(7, Qt::Horizontal).toInt()",
                                          "1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x1aa);
                  QVariant::~QVariant(&local_348);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_360);
                    bVar2 = GenericModel::removeColumns((int)&probe + 8,2,(QModelIndex *)0x2);
                    bVar2 = QTest::qVerify((bool)(bVar2 & 1),"testModel.removeColumns(2, 2)","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x1ac);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      QModelIndex::QModelIndex((QModelIndex *)&__range1_2);
                      iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
                      bVar2 = QTest::qCompare(iVar4,8,"testModel.columnCount()","8",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x1ad);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        spy_2 = (QSignalSpy *)(spyArr + 1);
                        __end1_2 = &local_1b8;
                        __begin1_2 = __end1_2;
                        for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
                          local_398 = *__end1_2;
                          local_3a0 = QList<QList<QVariant>_>::count
                                                (&local_398->super_QList<QList<QVariant>_>);
                          args_2.d.size._4_4_ = 1;
                          bVar3 = QTest::qCompare<long_long,int>
                                            (&local_3a0,(qint32 *)((long)&args_2.d.size + 4),
                                             "spy->count()","1",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x1af);
                          if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_00112314;
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)local_3c0,
                                     &local_398->super_QList<QList<QVariant>_>);
                          pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_3c0,2);
                          iVar4 = QVariant::toInt((bool *)pQVar6);
                          bVar2 = QTest::qCompare(iVar4,3,"args.at(2).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1b1);
                          if ((bVar2 & 1) == 0) {
                            bVar3 = true;
                          }
                          else {
                            pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_3c0,1);
                            iVar4 = QVariant::toInt((bool *)pQVar6);
                            bVar2 = QTest::qCompare(iVar4,2,"args.at(1).toInt()","2",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1b2);
                            if ((bVar2 & 1) == 0) {
                              bVar3 = true;
                            }
                            else {
                              pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_3c0,0);
                              QVariant::value<QModelIndex>(&local_3d8,pQVar6);
                              QModelIndex::QModelIndex(&local_3f0);
                              bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                                (&local_3d8,&local_3f0,
                                                 "args.at(0).value<QModelIndex>()","QModelIndex()",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x1b3);
                              if (((bVar3 ^ 0xffU) & 1) == 0) {
                                bVar3 = false;
                              }
                              else {
                                bVar3 = true;
                              }
                            }
                          }
                          QList<QVariant>::~QList((QList<QVariant> *)local_3c0);
                          if (bVar3) goto LAB_00112314;
                        }
                        GenericModel::headerData((int)&local_410,(int)&probe + 8,5);
                        iVar4 = QVariant::toInt((bool *)&local_410);
                        bVar2 = QTest::qCompare(iVar4,1,
                                                "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                "1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1b5);
                        QVariant::~QVariant(&local_410);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          QModelIndex::QModelIndex(&local_428);
                          bVar2 = GenericModel::removeColumns((int)&probe + 8,0,(QModelIndex *)0x0);
                          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.removeColumns(0, 0)"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x1b7);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            QModelIndex::QModelIndex((QModelIndex *)&__range1_3);
                            iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
                            bVar2 = QTest::qCompare(iVar4,8,"testModel.columnCount()","8",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1b8);
                            if (((bVar2 ^ 0xff) & 1) == 0) {
                              spy_3 = (QSignalSpy *)(spyArr + 1);
                              __end1_3 = &local_1b8;
                              __begin1_3 = __end1_3;
                              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                                local_460 = *__end1_3;
                                local_468 = QList<QList<QVariant>_>::count
                                                      (&local_460->super_QList<QList<QVariant>_>);
                                local_46c = 0;
                                bVar3 = QTest::qCompare<long_long,int>
                                                  (&local_468,&local_46c,"spy->count()","0",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1ba);
                                if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_00112314;
                              }
                              QModelIndex::QModelIndex(&local_488);
                              bVar2 = GenericModel::removeColumns
                                                ((int)&probe + 8,2,(QModelIndex *)0x0);
                              bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                                     "!testModel.removeColumns(2, 0)","",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1bb);
                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                QModelIndex::QModelIndex((QModelIndex *)&__range1_4);
                                iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
                                bVar2 = QTest::qCompare(iVar4,8,"testModel.columnCount()","8",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1bc);
                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                  spy_4 = (QSignalSpy *)(spyArr + 1);
                                  __end1_4 = &local_1b8;
                                  __begin1_4 = __end1_4;
                                  for (; (QSignalSpy *)__end1_4 != spy_4; __end1_4 = __end1_4 + 1) {
                                    local_4c0 = *__end1_4;
                                    local_4c8 = QList<QList<QVariant>_>::count
                                                          (&local_4c0->super_QList<QList<QVariant>_>
                                                          );
                                    local_4cc = 0;
                                    bVar3 = QTest::qCompare<long_long,int>
                                                      (&local_4c8,&local_4cc,"spy->count()","0",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1be);
                                    if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_00112314;
                                  }
                                  QModelIndex::QModelIndex(&local_4e8);
                                  bVar2 = GenericModel::removeColumns
                                                    ((int)&probe + 8,-1,(QModelIndex *)0x2);
                                  bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                                         "!testModel.removeColumns(-1, 2)","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1bf);
                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                    QModelIndex::QModelIndex((QModelIndex *)&__range1_5);
                                    iVar4 = GenericModel::columnCount
                                                      ((QModelIndex *)&probe.field_0x8);
                                    bVar2 = QTest::qCompare(iVar4,8,"testModel.columnCount()","8",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c0);
                                    if (((bVar2 ^ 0xff) & 1) == 0) {
                                      spy_5 = (QSignalSpy *)(spyArr + 1);
                                      __end1_5 = &local_1b8;
                                      __begin1_5 = __end1_5;
                                      for (; (QSignalSpy *)__end1_5 != spy_5;
                                          __end1_5 = __end1_5 + 1) {
                                        local_520 = *__end1_5;
                                        local_528 = QList<QList<QVariant>_>::count
                                                              (&local_520->
                                                                super_QList<QList<QVariant>_>);
                                        local_52c = 0;
                                        bVar3 = QTest::qCompare<long_long,int>
                                                          (&local_528,&local_52c,"spy->count()","0",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c2);
                                        if (((bVar3 ^ 0xffU) & 1) != 0) goto LAB_00112314;
                                      }
                                      QModelIndex::QModelIndex(&local_548);
                                      bVar2 = GenericModel::removeColumns
                                                        ((int)&probe + 8,9,(QModelIndex *)0x2);
                                      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                                             "!testModel.removeColumns(9, 2)","",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c3);
                                      if (((bVar2 ^ 0xff) & 1) == 0) {
                                        QModelIndex::QModelIndex((QModelIndex *)&__range1_6);
                                        iVar4 = GenericModel::columnCount
                                                          ((QModelIndex *)&probe.field_0x8);
                                        bVar2 = QTest::qCompare(iVar4,8,"testModel.columnCount()",
                                                                "8",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c4);
                                        if (((bVar2 ^ 0xff) & 1) == 0) {
                                          spy_6 = (QSignalSpy *)(spyArr + 1);
                                          __end1_6 = &local_1b8;
                                          __begin1_6 = __end1_6;
                                          for (; (QSignalSpy *)__end1_6 != spy_6;
                                              __end1_6 = __end1_6 + 1) {
                                            local_580 = *__end1_6;
                                            local_588 = QList<QList<QVariant>_>::count
                                                                  (&local_580->
                                                                    super_QList<QList<QVariant>_>);
                                            local_58c = 0;
                                            bVar3 = QTest::qCompare<long_long,int>
                                                              (&local_588,&local_58c,"spy->count()",
                                                               "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c6);
                                            if (((bVar3 ^ 0xffU) & 1) != 0) break;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00112314:
      QSignalSpy::~QSignalSpy((QSignalSpy *)(spyArr + 1));
    }
    QSignalSpy::~QSignalSpy((QSignalSpy *)&columnsRemovedSpy.m_waiting);
  }
  ModelTest::~ModelTest((ModelTest *)local_40);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::removeColumns()
{
    QFETCH(int, insertRow);
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    if (insertRow > 0)
        testModel.insertRows(0, insertRow);
    QVERIFY(testModel.insertColumns(0, 13));
    testModel.setHeaderData(10, Qt::Horizontal, 1);

    QSignalSpy columnsAboutToBeRemovedSpy(&testModel, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(columnsAboutToBeRemovedSpy.isValid());
    QSignalSpy columnsRemovedSpy(&testModel, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(columnsRemovedSpy.isValid());
    QSignalSpy *const spyArr[] = {&columnsRemovedSpy, &columnsAboutToBeRemovedSpy};

    QVERIFY(testModel.removeColumns(0, 1));
    QCOMPARE(testModel.columnCount(), 12);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(9, Qt::Horizontal).toInt(), 1);
    QVERIFY(testModel.removeColumns(0, 2));
    QCOMPARE(testModel.columnCount(), 10);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(7, Qt::Horizontal).toInt(), 1);

    QVERIFY(testModel.removeColumns(2, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 3);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 1);

    QVERIFY(!testModel.removeColumns(0, 0));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(2, 0));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(-1, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(9, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
}